

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O1

int CheckForMissingSegs(void)

{
  size_t __n;
  double *pdVar1;
  double *pdVar2;
  seg_t *psVar3;
  void *__s;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  
  __n = (long)numsides * 8;
  uVar6 = 0xffffffffffffffff;
  if (-1 < (long)numsides) {
    uVar6 = __n;
  }
  __s = operator_new__(uVar6);
  iVar5 = 0;
  memset(__s,0,__n);
  if (0 < numsegs) {
    lVar7 = 0x10;
    lVar8 = 0;
    do {
      psVar3 = segs;
      if (*(long *)((long)&segs->v1 + lVar7) != 0) {
        pdVar1 = *(double **)((long)segs + lVar7 + -0x10);
        pdVar2 = *(double **)((long)segs + lVar7 + -8);
        dVar10 = *pdVar2 - *pdVar1;
        dVar9 = pdVar2[1] - pdVar1[1];
        dVar9 = c_sqrt(dVar9 * dVar9 + dVar10 * dVar10);
        lVar4 = (*(long *)((long)&psVar3->v1 + lVar7) - (long)sides >> 3) * -0x5555555555555555;
        *(double *)((long)__s + lVar4) = dVar9 + *(double *)((long)__s + lVar4);
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x30;
    } while (lVar8 < numsegs);
  }
  if (0 < numsides) {
    lVar7 = 0;
    lVar8 = 0x14;
    iVar5 = 0;
    do {
      lVar4 = *(long *)((long)sides->textures + lVar8 * 8 + -0x10);
      dVar9 = *(double *)(lVar4 + 0x10);
      dVar10 = *(double *)(lVar4 + 0x18);
      dVar9 = c_sqrt(dVar10 * dVar10 + dVar9 * dVar9);
      pdVar1 = (double *)((long)__s + lVar7 * 8);
      iVar5 = iVar5 + (uint)(*pdVar1 <= dVar9 + -1.0 && dVar9 + -1.0 != *pdVar1);
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x18;
    } while (lVar7 < numsides);
  }
  operator_delete__(__s);
  return iVar5;
}

Assistant:

static int CheckForMissingSegs()
{
	double *added_seglen = new double[numsides];
	int missing = 0;

	memset(added_seglen, 0, sizeof(double)*numsides);
	for(int i=0;i<numsegs;i++)
	{
		seg_t * seg = &segs[i];

		if (seg->sidedef!=NULL)
		{
			// check all the segs and calculate the length they occupy on their sidedef
			DVector2 vec1(seg->v2->fX() - seg->v1->fX(), seg->v2->fY() - seg->v1->fY());
			added_seglen[seg->sidedef - sides] += vec1.Length();
		}
	}

	for(int i=0;i<numsides;i++)
	{
		double linelen = sides[i].linedef->Delta().Length();
		missing += (added_seglen[i] < linelen - 1.);
	}

	delete [] added_seglen;
	return missing;
}